

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_test.cpp
# Opt level: O0

void __thiscall FFT_MultipliesBothEmpty_Test::TestBody(FFT_MultipliesBothEmpty_Test *this)

{
  pointer *this_00;
  initializer_list<long_long> __l;
  bool bVar1;
  char *message;
  AssertHelper local_d0;
  Message local_c8;
  allocator<long_long> local_b9;
  longlong local_b8 [2];
  iterator local_a8;
  size_type local_a0;
  vector<long_long,_std::allocator<long_long>_> local_98;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  undefined1 local_60 [8];
  vector<long_long,_std::allocator<long_long>_> res;
  vector<long_long,_std::allocator<long_long>_> p2;
  undefined1 auStack_28 [8];
  vector<long_long,_std::allocator<long_long>_> p1;
  FFT_MultipliesBothEmpty_Test *this_local;
  
  auStack_28 = (undefined1  [8])0x0;
  p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)auStack_28);
  res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = &res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)this_00);
  multiplyPolynomials((vector<long_long,_std::allocator<long_long>_> *)local_60,
                      (vector<long_long,_std::allocator<long_long>_> *)auStack_28,
                      (vector<long_long,_std::allocator<long_long>_> *)this_00);
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_a8 = local_b8;
  local_a0 = 2;
  std::allocator<long_long>::allocator(&local_b9);
  __l._M_len = local_a0;
  __l._M_array = local_a8;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_98,__l,&local_b9);
  testing::internal::EqHelper<false>::
  Compare<std::vector<long_long,std::allocator<long_long>>,std::vector<long_long,std::allocator<long_long>>>
            ((EqHelper<false> *)local_80,"(vector<ll> {0, 0})","res",&local_98,
             (vector<long_long,_std::allocator<long_long>_> *)local_60);
  std::vector<long_long,_std::allocator<long_long>_>::~vector(&local_98);
  std::allocator<long_long>::~allocator(&local_b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/numerical/fft_test.cpp"
               ,0x2d,message);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_60);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)
             &res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)auStack_28);
  return;
}

Assistant:

TEST(FFT, MultipliesBothEmpty) {
    vector<ll> p1 = {};
    vector<ll> p2 = {};
    vector<ll> res = multiplyPolynomials(p1, p2);
    EXPECT_EQ((vector<ll> {0, 0}), res);
}